

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

int64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getSmallIntUnchecked(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  do {
    bVar1 = **(byte **)this;
    if ((byte)(bVar1 - 0x30) < 10) {
      return (ulong)(bVar1 & 0xf);
    }
    if ((byte)(bVar1 - 0x3a) < 6) {
      return (long)(char)bVar1 | 0xffffffffffffffc0;
    }
    if (((int)(char)bVar1 & 0xf0U | 8) != 0x28) {
      return 0;
    }
    pbVar3 = *(byte **)this;
    bVar1 = *pbVar3;
  } while ((bVar1 & 0xf8) != 0x20);
  switch(bVar1) {
  case 0x20:
    uVar4 = (ulong)pbVar3[1];
    break;
  case 0x21:
    uVar4 = (ulong)*(ushort *)(pbVar3 + 1);
    break;
  case 0x22:
    uVar5 = (ulong)((uint)pbVar3[2] << 8 | (uint)pbVar3[3] << 0x10);
    uVar4 = (ulong)pbVar3[1];
    goto LAB_0010e072;
  case 0x23:
    uVar4 = (ulong)*(uint *)(pbVar3 + 1);
    break;
  case 0x24:
    uVar2 = *(uint *)(pbVar3 + 1);
    uVar4 = (ulong)pbVar3[5];
    goto LAB_0010e055;
  case 0x25:
    uVar2 = *(uint *)(pbVar3 + 1);
    uVar4 = (ulong)*(ushort *)(pbVar3 + 5);
LAB_0010e055:
    uVar4 = uVar4 << 0x20 | (ulong)uVar2;
    break;
  case 0x26:
    uVar5 = (ulong)*(uint3 *)(pbVar3 + 5) << 0x20;
    uVar4 = (ulong)*(uint *)(pbVar3 + 1);
LAB_0010e072:
    uVar4 = uVar4 | uVar5;
    break;
  case 0x27:
    uVar4 = *(ulong *)(pbVar3 + 1);
    break;
  default:
    uVar4 = 0;
  }
  if (bVar1 != 0x27) {
    lVar6 = 0;
    if (*(long *)((anonymous_namespace)::maxValues + (ulong)(bVar1 & 7) * 8) <= (long)uVar4) {
      lVar6 = *(long *)((anonymous_namespace)::maxValues + (ulong)(bVar1 & 7) * 8) * 2;
    }
    uVar4 = uVar4 - lVar6;
  }
  return uVar4;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }